

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  undefined1 auVar4 [16];
  ImGuiContext *pIVar5;
  ImGuiWindow *pIVar6;
  ImGuiWindow *pIVar7;
  ImGuiWindow *pIVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ImGuiContext *g;
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [64];
  undefined8 in_XMM1_Qb;
  ImRect IVar14;
  undefined1 auVar13 [56];
  
  pIVar5 = GImGui;
  auVar13 = in_ZMM0._8_56_;
  if (GImGui->ActiveId != 0) {
    return;
  }
  if (GImGui->HoveredId != 0) {
    return;
  }
  pIVar6 = GImGui->NavWindow;
  if ((pIVar6 != (ImGuiWindow *)0x0) && (pIVar6->Appearing != false)) {
    return;
  }
  if ((GImGui->IO).MouseClicked[0] != true) goto LAB_0014ef3c;
  pIVar8 = GImGui->HoveredRootWindow;
  if (pIVar8 == (ImGuiWindow *)0x0) {
    if ((pIVar6 != (ImGuiWindow *)0x0) &&
       (pIVar6 = GetTopMostPopupModal(), pIVar6 == (ImGuiWindow *)0x0)) {
      FocusWindow((ImGuiWindow *)0x0);
    }
    goto LAB_0014ef3c;
  }
  if ((pIVar8->Flags & 0x4000000) != 0) {
    lVar9 = (long)(GImGui->OpenPopupStack).Size;
    if (0 < lVar9) {
      lVar10 = 0;
      do {
        if (*(ImGuiID *)((long)&((GImGui->OpenPopupStack).Data)->PopupId + lVar10) ==
            pIVar8->PopupId) goto LAB_0014ee65;
        lVar10 = lVar10 + 0x30;
      } while (lVar9 * 0x30 != lVar10);
    }
    goto LAB_0014ef3c;
  }
LAB_0014ee65:
  StartMouseMovingWindow(GImGui->HoveredWindow);
  if (((pIVar5->IO).ConfigWindowsMoveFromTitleBarOnly == true) && ((pIVar8->Flags & 1) == 0)) {
    IVar14 = ImGuiWindow::TitleBarRect(pIVar8);
    auVar12._0_8_ = IVar14.Min;
    auVar12._8_56_ = auVar13;
    fVar1 = (pIVar5->IO).MouseClickedPos[0].x;
    if (IVar14.Min.x <= fVar1) {
      fVar2 = (pIVar5->IO).MouseClickedPos[0].y;
      auVar4 = vmovshdup_avx(auVar12._0_16_);
      if (((auVar4._0_4_ <= fVar2) && (fVar1 < IVar14.Max.x)) &&
         (auVar4._8_8_ = in_XMM1_Qb, auVar4._0_4_ = IVar14.Max.x, auVar4._4_4_ = IVar14.Max.y,
         auVar4 = vmovshdup_avx(auVar4), fVar2 < auVar4._0_4_)) goto LAB_0014ef27;
    }
    pIVar5->MovingWindow = (ImGuiWindow *)0x0;
  }
LAB_0014ef27:
  if (pIVar5->HoveredIdDisabled == true) {
    pIVar5->MovingWindow = (ImGuiWindow *)0x0;
  }
LAB_0014ef3c:
  if ((pIVar5->IO).MouseClicked[1] != true) {
    return;
  }
  pIVar7 = GetTopMostPopupModal();
  pIVar6 = pIVar5->HoveredWindow;
  pIVar8 = pIVar7;
  if (pIVar6 != (ImGuiWindow *)0x0) {
    uVar11 = (ulong)(uint)(GImGui->Windows).Size;
    do {
      pIVar8 = pIVar7;
      if (((int)uVar11 < 1) ||
         (pIVar3 = (GImGui->Windows).Data[uVar11 - 1], pIVar8 = pIVar6, pIVar3 == pIVar6)) break;
      uVar11 = uVar11 - 1;
      pIVar8 = pIVar7;
    } while (pIVar3 != pIVar7);
  }
  ClosePopupsOverWindow(pIVar8,true);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click on empty space to focus window and start moving
    // (after we're done with all our widgets)
    if (g.IO.MouseClicked[0])
    {
        // Handle the edge case of a popup being closed while clicking in its empty space.
        // If we try to focus it, FocusWindow() > ClosePopupsOverWindow() will accidentally close any parent popups because they are not linked together any more.
        ImGuiWindow* root_window = g.HoveredRootWindow;
        const bool is_closed_popup = root_window && (root_window->Flags & ImGuiWindowFlags_Popup) && !IsPopupOpen(root_window->PopupId, ImGuiPopupFlags_AnyPopupLevel);

        if (root_window != NULL && !is_closed_popup)
        {
            StartMouseMovingWindow(g.HoveredWindow); //-V595

            // Cancel moving if clicked outside of title bar
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(root_window->Flags & ImGuiWindowFlags_NoTitleBar))
                if (!root_window->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                    g.MovingWindow = NULL;

            // Cancel moving if clicked over an item which was disabled or inhibited by popups (note that we know HoveredId == 0 already)
            if (g.HoveredIdDisabled)
                g.MovingWindow = NULL;
        }
        else if (root_window == NULL && g.NavWindow != NULL && GetTopMostPopupModal() == NULL)
        {
            // Clicking on void disable focus
            FocusWindow(NULL);
        }
    }

    // With right mouse button we close popups without changing focus based on where the mouse is aimed
    // Instead, focus will be restored to the window under the bottom-most closed popup.
    // (The left mouse button path calls FocusWindow on the hovered window, which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the top-most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetTopMostPopupModal();
        bool hovered_window_above_modal = g.HoveredWindow && IsWindowAbove(g.HoveredWindow, modal);
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal, true);
    }
}